

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_netinfo.cpp
# Opt level: O2

uint32 __thiscall userinfo_t::ColorChanged(userinfo_t *this,uint32 colorval)

{
  UCVarValue value;
  FBaseCVar **ppFVar1;
  FName local_c;
  
  value._4_4_ = 0;
  value.Int = colorval;
  local_c.Index = 0x204;
  ppFVar1 = TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::operator[]
                      (&this->
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                       ,&local_c);
  if (*ppFVar1 != (FBaseCVar *)0x0) {
    FBaseCVar::SetGenericRep(*ppFVar1,value,CVAR_Int);
    return colorval;
  }
  __assert_fail("color != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/d_netinfo.cpp"
                ,0x1f6,"uint32 userinfo_t::ColorChanged(uint32)");
}

Assistant:

uint32 userinfo_t::ColorChanged(uint32 colorval)
{
	FColorCVar *color = static_cast<FColorCVar *>((*this)[NAME_Color]);
	assert(color != NULL);
	UCVarValue val;
	val.Int = colorval;
	color->SetGenericRep(val, CVAR_Int);
	// This version is called by the menu code. Do not implicitly set colorset.
	return colorval;
}